

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  size_t sVar1;
  size_t sVar2;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  sVar1 = ZSTD_CCtx_refCDict(zcs,(ZSTD_CDict *)0x0);
  if (sVar1 < 0xffffffffffffff89) {
    sVar2 = ZSTD_CCtx_setParameter(zcs,ZSTD_c_compressionLevel,compressionLevel);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}